

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O3

void duckdb::ApproxTopKOperation::Destroy<duckdb::ApproxTopKState>
               (ApproxTopKState *state,AggregateInputData *aggr_input_data)

{
  InternalApproxTopKState *pIVar1;
  pointer puVar2;
  pointer prVar3;
  _Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_> _Var4
  ;
  pointer *__ptr;
  
  pIVar1 = state->state;
  if (pIVar1 != (InternalApproxTopKState *)0x0) {
    puVar2 = (pIVar1->filter).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    ::std::
    _Hashtable<duckdb::ApproxTopKString,_std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>,_std::allocator<std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>_>,_std::__detail::_Select1st,_duckdb::ApproxTopKEquality,_duckdb::ApproxTopKHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&(pIVar1->lookup_map)._M_h);
    prVar3 = (pIVar1->values).
             super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (prVar3 != (pointer)0x0) {
      operator_delete(prVar3);
    }
    _Var4.super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl =
         (pIVar1->stored_values).
         super_unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue[]>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::ApproxTopKValue,_std::default_delete<duckdb::ApproxTopKValue[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_>
         .super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>;
    if (_Var4.super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl !=
        (ApproxTopKValue *)0x0) {
      operator_delete__((void *)_Var4.super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>.
                                _M_head_impl);
    }
  }
  operator_delete(pIVar1);
  return;
}

Assistant:

static void Destroy(STATE &state, AggregateInputData &aggr_input_data) {
		delete state.state;
	}